

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void duckdb_je_extent_record
               (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *edata)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  ssize_t sVar4;
  mutex_prof_data_t *data;
  eset_t *eset;
  pthread_mutex_t *__mutex;
  _Bool coalesced;
  _Bool coalesced_unused;
  _Bool local_3a;
  _Bool local_39;
  pthread_mutex_t *local_38;
  
  __mutex = (pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ecache->mtx);
    (ecache->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(ecache->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((ecache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (ecache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(ecache->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if ((edata->e_bits & 0x10000) == 0) {
    if (ecache->delay_coalesce == false) {
      edata = extent_try_coalesce_impl(tsdn,pac,ehooks,ecache,edata,&local_39);
    }
    else if (0x3fff < (edata->field_2).e_size_esn) {
      local_38 = __mutex;
      do {
        edata = extent_try_coalesce_impl(tsdn,pac,ehooks,ecache,edata,&local_3a);
      } while (local_3a != false);
      __mutex = local_38;
      if (((((pac->duckdb_je_oversize_threshold).repr <=
             ((edata->field_2).e_size_esn & 0xfffffffffffff000)) &&
           ((duckdb_je_background_thread_enabled_state.repr & 1U) == 0)) &&
          (sVar4 = duckdb_je_pac_decay_ms_get(pac,extent_state_dirty), __mutex = local_38,
          sVar4 != -1)) &&
         (sVar4 = duckdb_je_pac_decay_ms_get(pac,extent_state_muzzy), __mutex = local_38,
         sVar4 != -1)) {
        (ecache->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(local_38);
        extent_maximally_purge(tsdn,pac,ehooks,edata);
        return;
      }
    }
  }
  duckdb_je_emap_update_edata_state(tsdn,pac->emap,edata,ecache->state);
  eset = &ecache->guarded_eset;
  if (((uint)edata->e_bits >> 0x10 & 1) == 0) {
    eset = &ecache->eset;
  }
  duckdb_je_eset_insert(eset,edata);
  (ecache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
extent_record(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *edata) {
	assert((ecache->state != extent_state_dirty &&
	    ecache->state != extent_state_muzzy) ||
	    !edata_zeroed_get(edata));

	malloc_mutex_lock(tsdn, &ecache->mtx);

	emap_assert_mapped(tsdn, pac->emap, edata);

	if (edata_guarded_get(edata)) {
		goto label_skip_coalesce;
	}
	if (!ecache->delay_coalesce) {
		bool coalesced_unused;
		edata = extent_try_coalesce(tsdn, pac, ehooks, ecache, edata,
		    &coalesced_unused);
	} else if (edata_size_get(edata) >= SC_LARGE_MINCLASS) {
		assert(ecache == &pac->ecache_dirty);
		/* Always coalesce large extents eagerly. */
		bool coalesced;
		do {
			assert(edata_state_get(edata) == extent_state_active);
			edata = extent_try_coalesce_large(tsdn, pac, ehooks,
			    ecache, edata, &coalesced);
		} while (coalesced);
		if (edata_size_get(edata) >=
		    atomic_load_zu(&pac->oversize_threshold, ATOMIC_RELAXED)
		    && !background_thread_enabled()
		    && extent_may_force_decay(pac)) {
			/* Shortcut to purge the oversize extent eagerly. */
			malloc_mutex_unlock(tsdn, &ecache->mtx);
			extent_maximally_purge(tsdn, pac, ehooks, edata);
			return;
		}
	}
label_skip_coalesce:
	extent_deactivate_locked(tsdn, pac, ecache, edata);

	malloc_mutex_unlock(tsdn, &ecache->mtx);
}